

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O3

RK_S32 parse_ptl(HEVCContext *s,PTL *ptl,int max_num_sub_layers)

{
  HEVCContext *s_00;
  MPP_RET MVar1;
  PTLCommon *ptl_00;
  ulong uVar2;
  RK_U8 *pRVar3;
  int iVar4;
  ulong uVar5;
  RK_S32 _out;
  byte local_3c [4];
  HEVCContext *local_38;
  
  s_00 = (HEVCContext *)s->HEVClc;
  decode_profile_tier_level(s_00,&ptl->general_ptl);
  MVar1 = mpp_read_bits((BitReadCtx_t *)s_00,8,(RK_S32 *)local_3c);
  *(MPP_RET *)((long)s_00->vps_list + 0x14) = MVar1;
  if (MVar1 == MPP_OK) {
    MVar1 = (MPP_RET)local_3c[0];
    (ptl->general_ptl).level_idc = local_3c[0];
    if (1 < max_num_sub_layers) {
      uVar2 = (ulong)(max_num_sub_layers - 1);
      uVar5 = 0;
      local_38 = s;
      do {
        MVar1 = mpp_read_bits((BitReadCtx_t *)s_00,1,(RK_S32 *)local_3c);
        *(MPP_RET *)((long)s_00->vps_list + 0x14) = MVar1;
        if (MVar1 != MPP_OK) {
          return MVar1;
        }
        ptl->sub_layer_profile_present_flag[uVar5] = local_3c[0];
        MVar1 = mpp_read_bits((BitReadCtx_t *)s_00,1,(RK_S32 *)local_3c);
        *(MPP_RET *)((long)s_00->vps_list + 0x14) = MVar1;
        if (MVar1 != MPP_OK) {
          return MVar1;
        }
        ptl->sub_layer_level_present_flag[uVar5] = local_3c[0];
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
      MVar1 = max_num_sub_layers + MPP_ERR_UNKNOW;
      if ((uint)MVar1 < 7) {
        iVar4 = max_num_sub_layers + -9;
        do {
          MVar1 = mpp_skip_longbits((BitReadCtx_t *)s_00,2);
          *(MPP_RET *)((long)s_00->vps_list + 0x14) = MVar1;
          if (MVar1 != MPP_OK) {
            return MVar1;
          }
          iVar4 = iVar4 + 1;
          MVar1 = MPP_OK;
        } while (iVar4 != 0);
      }
      if (1 < max_num_sub_layers) {
        pRVar3 = ptl->sub_layer_profile_present_flag;
        ptl_00 = ptl->sub_layer_ptl;
        do {
          if (*pRVar3 != '\0') {
            MVar1 = decode_profile_tier_level((HEVCContext *)local_38->HEVClc,ptl_00);
          }
          if (pRVar3[7] != '\0') {
            MVar1 = mpp_read_bits((BitReadCtx_t *)s_00,8,(RK_S32 *)local_3c);
            *(MPP_RET *)((long)s_00->vps_list + 0x14) = MVar1;
            if (MVar1 != MPP_OK) {
              return MVar1;
            }
            MVar1 = (MPP_RET)local_3c[0];
            ptl_00->level_idc = local_3c[0];
          }
          pRVar3 = pRVar3 + 1;
          ptl_00 = ptl_00 + 1;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
    }
  }
  return MVar1;
}

Assistant:

static RK_S32 parse_ptl(HEVCContext *s, PTL *ptl, int max_num_sub_layers)
{
    RK_S32 i;
    HEVCLocalContext *lc = s->HEVClc;
    BitReadCtx_t *gb = &lc->gb;

    decode_profile_tier_level(s, &ptl->general_ptl);
    READ_BITS(gb, 8, &ptl->general_ptl.level_idc);

    for (i = 0; i < max_num_sub_layers - 1; i++) {
        READ_ONEBIT(gb, &ptl->sub_layer_profile_present_flag[i]);
        READ_ONEBIT(gb, &ptl->sub_layer_level_present_flag[i]);
    }
    if (max_num_sub_layers - 1 > 0)
        for (i = max_num_sub_layers - 1; i < 8; i++)
            SKIP_BITS(gb, 2); // reserved_zero_2bits[i]
    for (i = 0; i < max_num_sub_layers - 1; i++) {
        if (ptl->sub_layer_profile_present_flag[i])
            decode_profile_tier_level(s, &ptl->sub_layer_ptl[i]);
        if (ptl->sub_layer_level_present_flag[i])
            READ_BITS(gb, 8, &ptl->sub_layer_ptl[i].level_idc);
    }

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}